

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O3

int av1_encode_strategy(AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,uint *frame_flags,
                       int64_t *time_stamp,int64_t *time_end,aom_rational64_t *timestamp_ratio,
                       int *pop_lookahead,int flush)

{
  YV12_BUFFER_CONFIG *dst_ybc;
  byte bVar1;
  FRAME_UPDATE_TYPE FVar2;
  lookahead_ctx *plVar3;
  SequenceHeader *pSVar4;
  aom_metadata_array_t *arr;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  FRAME_TYPE FVar9;
  COMPRESSOR_STAGE stage;
  uint8_t uVar10;
  uint i_1;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  AV1_PRIMARY *pAVar15;
  lookahead_entry *plVar16;
  MB_MODE_INFO_EXT_FRAME *pMVar17;
  lookahead_entry *plVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 *puVar22;
  YV12_BUFFER_CONFIG *pYVar23;
  byte bVar24;
  RefCntBuffer **ppRVar25;
  ulong uVar26;
  aom_enc_pass aVar27;
  MV_STATS *pMVar28;
  long lVar29;
  RefCntBuffer *pRVar30;
  MV_STATS *pMVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  int *piVar35;
  AV1_PRIMARY *pAVar36;
  size_t *psVar37;
  bool bVar38;
  char cVar39;
  double dVar40;
  double dVar41;
  EncodeFrameInput frame_input;
  size_t frame_size;
  RefFrameMapPair ref_frame_map_pairs [8];
  YV12_BUFFER_CONFIG *ref_frame_buf [7];
  EncodeFrameInput local_158;
  EncodeFrameParams local_138;
  size_t *local_e0;
  AV1_COMMON *local_d8;
  size_t local_d0;
  int *local_c8;
  uint8_t *local_c0;
  size_t local_b8;
  int local_ac;
  FRAME_DIFF local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68 [7];
  
  bVar24 = 0;
  pAVar36 = cpi->ppi;
  local_158.source = (YV12_BUFFER_CONFIG *)0x0;
  local_158.last_source = (YV12_BUFFER_CONFIG *)0x0;
  local_158.ts_duration = 0;
  local_138.error_resilient_mode = 0;
  local_138.frame_type = '\0';
  local_138._5_3_ = 0;
  local_138.primary_ref_frame = 0;
  local_138.order_offset = 0;
  local_138.show_frame = 0;
  local_138.refresh_frame_flags = 0;
  local_138.show_existing_frame = 0;
  local_138.existing_fb_idx_to_show = 0;
  local_138.ref_frame_flags = 0;
  local_138.remapped_ref_idx[0] = 0;
  local_138.remapped_ref_idx[1] = 0;
  local_138.remapped_ref_idx[2] = 0;
  local_138.remapped_ref_idx[3] = 0;
  local_138.remapped_ref_idx[4] = 0;
  local_138.remapped_ref_idx[5] = 0;
  local_138.remapped_ref_idx[6] = 0;
  local_138.remapped_ref_idx[7] = 0;
  local_138.refresh_frame.golden_frame = false;
  local_138.refresh_frame.bwd_ref_frame = false;
  local_138.refresh_frame.alt_ref_frame = false;
  local_138._71_1_ = 0;
  local_138.speed = 0;
  local_d0 = 0;
  pAVar15 = pAVar36;
  local_c0 = dest;
  local_b8 = dest_size;
  if (flush == 0) {
    uVar11 = av1_lookahead_depth(pAVar36->lookahead,cpi->compressor_stage);
    iVar12 = av1_lookahead_pop_sz(cpi->ppi->lookahead,cpi->compressor_stage);
    if ((int)uVar11 < iVar12) {
      return -1;
    }
    pAVar15 = cpi->ppi;
  }
  plVar16 = av1_lookahead_peek(pAVar15->lookahead,0,cpi->compressor_stage);
  if (plVar16 == (lookahead_entry *)0x0) goto LAB_003bf935;
  local_d8 = &cpi->common;
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
    iVar12 = (cpi->oxcf).gf_cfg.gf_min_pyr_height;
    iVar13 = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
    iVar14 = 1;
    if (iVar13 < 1) {
      iVar14 = iVar13;
    }
    (cpi->oxcf).gf_cfg.gf_max_pyr_height = iVar14;
    if (iVar12 < iVar14) {
      iVar14 = iVar12;
    }
    (cpi->oxcf).gf_cfg.gf_min_pyr_height = iVar14;
  }
  local_e0 = size;
  iVar12 = av1_alloc_context_buffers
                     (local_d8,(cpi->common).width,(cpi->common).height,
                      (cpi->sf).part_sf.default_min_partition_size);
  if (iVar12 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers")
    ;
  }
  aVar27 = (cpi->oxcf).pass;
  if (aVar27 == AOM_RC_FIRST_PASS) {
    cpi->skip_tpl_setup_stats = 0;
LAB_003bf423:
    (cpi->twopass_frame).this_frame = (FIRSTPASS_STATS *)0x0;
    bVar38 = true;
    local_c8 = &cpi->skip_tpl_setup_stats;
LAB_003bf639:
    local_138._24_8_ = local_138._24_8_ & 0xffffffff00000000;
LAB_003bf644:
    pAVar15 = cpi->ppi;
    bVar24 = (pAVar15->gf_group).arf_src_offset[cpi->gf_frame_index];
    uVar11 = (uint)bVar24;
    iVar12 = flush;
    if ((bVar24 != 0) &&
       ((((iVar12 = is_forced_keyframe_pending
                              (pAVar15->lookahead,(uint)bVar24,cpi->compressor_stage), iVar12 == -1
          || ((cpi->oxcf).rc_cfg.mode == AOM_Q)) || ((cpi->oxcf).pass == AOM_RC_FIRST_PASS)) ||
        (iVar12 = 1, cpi->compressor_stage == '\x01')))) goto LAB_003bf698;
    flush = iVar12;
    *pop_lookahead = 1;
    uVar11 = 0;
    iVar13 = 1;
    iVar12 = flush;
    if (((cpi->oxcf).kf_cfg.enable_keyframe_filtering < 2) ||
       ((pAVar15->gf_group).update_type[cpi->gf_frame_index] != '\x03')) {
LAB_003bf80b:
      flush = iVar12;
      if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01'))
      goto LAB_003bf81d;
    }
    else {
      if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (bVar24 = cpi->compressor_stage, bVar24 != 1))
      {
        plVar3 = cpi->ppi->lookahead;
        if (plVar3 != (lookahead_ctx *)0x0) {
          iVar14 = plVar3->read_ctxs[bVar24].sz;
          if (iVar14 != 0) {
            uVar11 = 0;
            if (flush == 0) {
              iVar12 = 0;
              flush = 0;
              uVar11 = 0;
              if (iVar14 != plVar3->read_ctxs[bVar24].pop_sz) goto LAB_003bf80b;
            }
LAB_003bf698:
            *pop_lookahead = 0;
            iVar13 = 0;
            iVar12 = flush;
          }
        }
        goto LAB_003bf80b;
      }
LAB_003bf81d:
      *pop_lookahead = 1;
      uVar11 = 0;
      iVar13 = 1;
    }
    local_138.show_frame = iVar13;
    uVar32 = (pAVar15->gf_group).src_offset[cpi->gf_frame_index];
    if (((uVar32 != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) {
      uVar11 = uVar32;
    }
    if (iVar13 != 0) {
      pAVar15 = cpi->ppi;
      stage = cpi->compressor_stage;
      if ((cpi->common).current_frame.frame_number == 0) {
        plVar16 = (lookahead_entry *)0x0;
      }
      else {
        plVar16 = av1_lookahead_peek(pAVar15->lookahead,uVar11 - 1,stage);
        pAVar15 = cpi->ppi;
        stage = cpi->compressor_stage;
      }
      plVar18 = av1_lookahead_peek(pAVar15->lookahead,uVar11,stage);
      goto LAB_003bf8dd;
    }
    plVar18 = av1_lookahead_peek(cpi->ppi->lookahead,uVar11,cpi->compressor_stage);
    if (plVar18 == (lookahead_entry *)0x0) goto LAB_003bf935;
    (cpi->common).showable_frame = 1;
    plVar16 = (lookahead_entry *)0x0;
  }
  else {
    if (cpi->compressor_stage == '\x01') {
LAB_003bf51a:
      cpi->skip_tpl_setup_stats = 0;
    }
    else {
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [(cpi->common).mi_params.mi_alloc_bsize];
      iVar12 = (int)((bVar1 - 1) + (cpi->common).mi_params.mi_cols) / (int)(uint)bVar1;
      iVar13 = ((int)((cpi->common).mi_params.mi_rows + (bVar1 - 1)) / (int)(uint)bVar1) * iVar12;
      if (iVar13 <= (cpi->mbmi_ext_info).alloc_size) {
        (cpi->mbmi_ext_info).stride = iVar12;
        goto LAB_003bf51a;
      }
      aom_free((cpi->mbmi_ext_info).frame_base);
      (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
      (cpi->mbmi_ext_info).alloc_size = 0;
      pMVar17 = (MB_MODE_INFO_EXT_FRAME *)aom_malloc((long)iVar13 * 0x54);
      (cpi->mbmi_ext_info).frame_base = pMVar17;
      if (pMVar17 == (MB_MODE_INFO_EXT_FRAME *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mbmi_ext_info->frame_base");
      }
      (cpi->mbmi_ext_info).alloc_size = iVar13;
      aVar27 = (cpi->oxcf).pass;
      (cpi->mbmi_ext_info).stride = iVar12;
      cpi->skip_tpl_setup_stats = 0;
      if (aVar27 == AOM_RC_FIRST_PASS) goto LAB_003bf423;
    }
    piVar35 = &cpi->skip_tpl_setup_stats;
    if ((cpi->ppi->tpl_data).tpl_stats_pool[0] == (TplDepStats *)0x0) {
      av1_setup_tpl_buffers
                (cpi->ppi,&(cpi->common).mi_params,(cpi->oxcf).frm_dim_cfg.width,
                 (cpi->oxcf).frm_dim_cfg.height,0,(cpi->oxcf).gf_cfg.lag_in_frames);
      aVar27 = (cpi->oxcf).pass;
    }
    (cpi->twopass_frame).this_frame = (FIRSTPASS_STATS *)0x0;
    bVar38 = true;
    local_c8 = piVar35;
    if (aVar27 == AOM_RC_FIRST_PASS) goto LAB_003bf639;
    if ((((aVar27 != AOM_RC_ONE_PASS) || (cpi->ppi->lap_enabled != 0)) ||
        ((cpi->oxcf).mode != '\x01')) || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)) {
      if (cpi->compressor_stage != '\x01') {
        pAVar15 = cpi->ppi;
        if (0 < (pAVar15->gf_group).frame_parallel_level[cpi->gf_frame_index]) {
          lVar29 = 0;
          do {
            (cpi->rc).frame_level_rate_correction_factors[lVar29] =
                 (pAVar15->p_rc).rate_correction_factors[lVar29];
            lVar29 = lVar29 + 1;
          } while (lVar29 != 4);
        }
        pMVar28 = &pAVar15->mv_stats;
        pMVar31 = &cpi->mv_stats;
        for (lVar29 = 9; lVar29 != 0; lVar29 = lVar29 + -1) {
          iVar12 = pMVar28->q;
          pMVar31->high_prec = pMVar28->high_prec;
          pMVar31->q = iVar12;
          pMVar28 = (MV_STATS *)((long)pMVar28 + ((ulong)bVar24 * -2 + 1) * 8);
          pMVar31 = (MV_STATS *)((long)pMVar31 + (ulong)bVar24 * -0x10 + 8);
        }
        (cpi->mv_stats).valid = (pAVar15->mv_stats).valid;
        av1_get_second_pass_params(cpi,&local_138,*frame_flags);
        bVar38 = true;
        if ((cpi->oxcf).pass != AOM_RC_FIRST_PASS) goto LAB_003bf62b;
      }
      goto LAB_003bf639;
    }
    bVar38 = false;
LAB_003bf62b:
    if (cpi->compressor_stage == '\x01') goto LAB_003bf639;
    FVar2 = (pAVar36->gf_group).update_type[cpi->gf_frame_index];
    if ((FVar2 != '\x04') ||
       ((uVar11 = 1, (pAVar36->gf_group).refbuf_state[cpi->gf_frame_index] != '\0' &&
        (cpi->ppi->show_existing_alt_ref == 0)))) {
      uVar11 = (uint)(FVar2 == '\x05');
    }
    local_138.show_existing_frame = uVar11;
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar11 = 0;
    }
    else {
      uVar32 = *frame_flags;
      plVar16 = av1_lookahead_peek(cpi->ppi->lookahead,0,cpi->compressor_stage);
      uVar11 = 1;
      if (plVar16 != (lookahead_entry *)0x0) {
        bVar24 = 1;
        if ((cpi->oxcf).tool_cfg.error_resilient_mode == false) {
          bVar24 = (*(byte *)((long)&plVar16->flags + 3) & 0x10) >> 4;
        }
        if (((cpi->oxcf).kf_cfg.enable_sframe != false) ||
           ((bVar24 | (byte)((ulong)plVar16->flags >> 0x1d) & 1) == 1)) {
          uVar11 = (byte)((byte)uVar32 | (cpi->rc).frames_to_key == 0) & 1;
        }
      }
    }
    uVar11 = uVar11 & local_138.show_existing_frame;
    local_138.show_existing_frame = uVar11;
    uVar20 = (ulong)cpi->gf_frame_index;
    if (((cpi->oxcf).rc_cfg.drop_frames_water_mark != 0) &&
       (((pAVar36->gf_group).update_type[uVar20] & 0xfe) == 4)) {
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else {
        uVar26 = 0;
        do {
          if ((pAVar36->gf_group).display_idx[uVar20] == (pAVar36->gf_group).display_idx[uVar26]) {
            if ((pAVar36->gf_group).is_frame_dropped[uVar26] == true) {
              local_138._24_8_ = (ulong)(uint)local_138.existing_fb_idx_to_show << 0x20;
              cpi->is_dropped_frame = true;
              uVar11 = 0;
            }
            break;
          }
          uVar26 = uVar26 + 1;
        } while (uVar20 != uVar26);
      }
    }
    if ((pAVar36->gf_group).update_type[uVar20] == '\x04') {
      cpi->ppi->show_existing_alt_ref = 0;
    }
    if (uVar11 == 0) goto LAB_003bf644;
    plVar16 = (lookahead_entry *)0x0;
    plVar18 = av1_lookahead_peek(cpi->ppi->lookahead,0,cpi->compressor_stage);
    *pop_lookahead = 1;
    local_138.show_frame = 1;
LAB_003bf8dd:
    if (plVar18 == (lookahead_entry *)0x0) {
LAB_003bf935:
      if (flush == 0) {
        return -1;
      }
      if ((cpi->oxcf).pass != AOM_RC_FIRST_PASS) {
        return -1;
      }
      if ((cpi->ppi->twopass).first_pass_done != 0) {
        return -1;
      }
      av1_end_first_pass(cpi);
      (cpi->ppi->twopass).first_pass_done = 1;
      return -1;
    }
  }
  (pAVar36->gf_group).src_offset[cpi->gf_frame_index] = 0;
  local_158.source = &plVar18->img;
  if (((cpi->ppi->use_svc != 0) || ((cpi->rc).prev_frame_is_dropped != 0)) &&
     (plVar16 != (lookahead_entry *)0x0)) {
    av1_svc_set_last_source(cpi,&local_158,&plVar16->img);
    plVar16 = (lookahead_entry *)local_158.last_source;
  }
  local_158.last_source = &plVar16->img;
  lVar29 = plVar18->ts_start;
  local_158.ts_duration = plVar18->ts_end - lVar29;
  cpi->unfiltered_source = local_158.source;
  *time_stamp = lVar29;
  *time_end = plVar18->ts_end;
  lVar29 = plVar18->ts_start;
  if (lVar29 < (cpi->time_stamps).first_ts_start) {
    (cpi->time_stamps).first_ts_start = lVar29;
    (cpi->time_stamps).prev_ts_end = lVar29;
  }
  av1_apply_encoding_flags(cpi,plVar18->flags);
  *frame_flags = (uint)plVar18->flags & 1;
  if (local_138.show_frame != 0) {
    lVar29 = plVar18->ts_start;
    lVar34 = plVar18->ts_end;
    pAVar15 = cpi->ppi;
    if (((pAVar15->use_svc == 0) || ((pAVar15->rtc_ref).set_ref_frame_config == 0)) ||
       (((cpi->svc).number_spatial_layers < 2 ||
        (lVar19 = lVar34 - lVar29, lVar19 == 0 || lVar34 < lVar29)))) {
      lVar21 = (cpi->time_stamps).first_ts_start;
      if (lVar21 == lVar29) {
        lVar19 = lVar34 - lVar29;
        if (lVar19 == 0) goto LAB_003bfab3;
        goto LAB_003bfa97;
      }
      lVar33 = (cpi->time_stamps).prev_ts_end;
      lVar19 = lVar34 - lVar33;
      lVar33 = lVar33 - (cpi->time_stamps).prev_ts_start;
      if (lVar33 == 0) {
        if (lVar19 == 0) goto LAB_003bfab3;
LAB_003bfcb5:
        lVar21 = lVar34 - lVar21;
        if (9999999 < lVar21) {
          lVar21 = 10000000;
        }
        dVar41 = 10000000.0 / cpi->framerate;
        dVar40 = 10000000.0 /
                 ((((double)lVar19 + ((double)lVar21 - dVar41)) * dVar41) / (double)lVar21);
        cpi->new_framerate = dVar40;
        dVar41 = cpi->framerate;
        if ((pAVar15->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1) {
          dVar41 = dVar40;
        }
        goto LAB_003bfaab;
      }
      if (lVar19 != 0) {
        if ((int)(((lVar19 - lVar33) * 10) / lVar33) != 0) goto LAB_003bfa97;
        goto LAB_003bfcb5;
      }
    }
    else {
LAB_003bfa97:
      cpi->new_framerate = 10000000.0 / (double)lVar19;
      dVar41 = 10000000.0 / (double)lVar19;
LAB_003bfaab:
      av1_new_framerate(cpi,dVar41);
    }
LAB_003bfab3:
    (cpi->time_stamps).prev_ts_start = lVar29;
    (cpi->time_stamps).prev_ts_end = lVar34;
  }
  if (local_138.show_existing_frame == 0) {
    if (cpi->film_grain_table == (aom_film_grain_table_t *)0x0) {
      uVar10 = ((cpi->common).seq_params)->film_grain_params_present;
    }
    else {
      iVar12 = aom_film_grain_table_lookup
                         (cpi->film_grain_table,*time_stamp,*time_end,0,
                          &(cpi->common).film_grain_params);
      uVar10 = (uint8_t)iVar12;
    }
    ((cpi->common).cur_frame)->film_grain_params_present = uVar10;
    lVar29 = timestamp_ratio->num;
    uVar20 = (long)((long)timestamp_ratio->den * *time_stamp + (lVar29 / 2 - (ulong)(1 < lVar29))) /
             lVar29;
    if (uVar20 >> 0x20 != 0) {
      return 1;
    }
    (cpi->common).frame_presentation_time = (uint32_t)uVar20;
  }
  if (((((!bVar38) &&
        (av1_get_one_pass_rt_params(cpi,&local_138.frame_type,&local_158,*frame_flags),
        (cpi->oxcf).pass == AOM_RC_ONE_PASS)) && (pAVar15 = cpi->ppi, pAVar15->lap_enabled == 0)) &&
      (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
     ((pAVar15->number_spatial_layers == 1 &&
      ((pAVar15->number_temporal_layers == 1 && ((pAVar15->rtc_ref).set_ref_frame_config == 0))))))
  {
    av1_set_rtc_reference_structure_one_layer(cpi,(uint)(cpi->gf_frame_index == '\0'));
  }
  FVar2 = (pAVar36->gf_group).update_type[cpi->gf_frame_index];
  if ((local_138.show_existing_frame != 0) && (local_138.frame_type != '\0')) {
    local_138.frame_type = '\x01';
  }
  local_138.speed = (cpi->oxcf).speed;
  aVar27 = (cpi->oxcf).pass;
  if (bVar38) {
    if ((aVar27 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
LAB_003bfc2d:
      bVar24 = 1;
      if (((cpi->common).current_frame.frame_number != 0) && ((cpi->oxcf).kf_cfg.key_freq_max != 0))
      {
        bVar24 = (byte)*frame_flags & 1;
      }
      bVar24 = (byte)(FVar2 - 6) < 0xfe & bVar24;
      if (aVar27 == AOM_RC_FIRST_PASS || bVar24 != 0) {
        bVar24 = bVar24 ^ 1;
      }
      else {
        bVar24 = 1;
        if (cpi->compressor_stage != '\x01') goto LAB_003bfc74;
      }
      local_138.frame_type = bVar24;
      goto LAB_003bfc74;
    }
    if (aVar27 != AOM_RC_FIRST_PASS) {
      if (aVar27 == AOM_RC_ONE_PASS) {
        if (cpi->ppi->lap_enabled == 0) goto LAB_003bfc2d;
        goto LAB_003bfc85;
      }
      goto LAB_003bfd45;
    }
LAB_003bfd4e:
    uVar11 = 0;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      uVar11 = (uint)((cpi->oxcf).rc_cfg.worst_allowed_q == 0);
    }
    (cpi->td).mb.e_mbd.lossless[0] = uVar11;
LAB_003bfd6b:
    if ((aVar27 != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) goto LAB_003bfd79;
  }
  else {
LAB_003bfc74:
    if (aVar27 == AOM_RC_FIRST_PASS) goto LAB_003bfd4e;
    if (aVar27 == AOM_RC_ONE_PASS) {
LAB_003bfc85:
      if ((cpi->ppi->lap_enabled != 0) || ((cpi->oxcf).q_cfg.aq_mode != '\x03')) goto LAB_003bfd45;
      av1_cyclic_refresh_update_parameters(cpi);
      aVar27 = (cpi->oxcf).pass;
      goto LAB_003bfd6b;
    }
LAB_003bfd45:
    if (cpi->compressor_stage == '\x01') goto LAB_003bfd4e;
LAB_003bfd79:
    if ((cpi->ext_flags).use_s_frame == true) {
      local_138._0_5_ = 0x300000000;
    }
    if ((cpi->ext_flags).refresh_frame_context_pending == true) {
      (cpi->common).features.refresh_frame_context = (cpi->ext_flags).refresh_frame_context;
      (cpi->ext_flags).refresh_frame_context_pending = false;
    }
    (cpi->common).features.allow_ref_frame_mvs = (cpi->ext_flags).use_ref_frame_mvs;
    bVar24 = (cpi->ext_flags).use_error_resilient;
    if (local_138.frame_type == '\0') {
      bVar24 = 0;
    }
    local_138.error_resilient_mode = (uint)(local_138.frame_type == '\x03' | bVar24);
  }
  av1_configure_buffer_updates
            (cpi,&local_138.refresh_frame,FVar2,
             (pAVar36->gf_group).refbuf_state[cpi->gf_frame_index],
             (uint)(local_138.show_existing_frame == 0 &&
                   (local_138.frame_type == '\x03' ||
                   local_138.show_frame != 0 && local_138.frame_type == '\0')));
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    pAVar15 = cpi->ppi;
    bVar24 = cpi->gf_frame_index;
    if ((pAVar15->gf_group).update_type[bVar24] == '\0') {
      local_78 = 0xffffffffffffffff;
      uStack_70 = 0xffffffffffffffff;
      local_88 = 0xffffffffffffffff;
      uStack_80 = 0xffffffffffffffff;
      local_98 = 0xffffffffffffffff;
      uStack_90 = 0xffffffffffffffff;
      local_a8.sum = -1;
      local_a8.sse = -1;
    }
    else {
      puVar22 = (undefined1 *)((long)&local_a8.sse + 4);
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8.sum = 0;
      local_a8.sse = 0;
      ppRVar25 = (cpi->common).ref_frame_map;
      lVar29 = 1;
      uVar20 = 0;
      do {
        ppRVar25 = ppRVar25 + 1;
        uVar26 = 6;
        if (6 < uVar20) {
          uVar26 = uVar20;
        }
        if (*(int *)((long)&local_a8.sum + uVar20 * 8 + 4) != -1) {
          pRVar30 = (cpi->common).ref_frame_map[uVar20];
          if (pRVar30 == (RefCntBuffer *)0x0) {
            *(undefined4 *)((long)&local_a8.sum + uVar20 * 8 + 4) = 0xffffffff;
            uVar11 = 0xffffffff;
          }
          else {
            if ((uVar20 != 7) && (1 < pRVar30->ref_count)) {
              lVar34 = 0;
              do {
                if (ppRVar25[lVar34] == pRVar30) {
                  *(undefined8 *)(puVar22 + lVar34 * 8 + -4) = 0xffffffffffffffff;
                }
                lVar34 = lVar34 + 1;
              } while (uVar26 + lVar29 != lVar34);
            }
            *(uint *)((long)&local_a8.sum + uVar20 * 8 + 4) = pRVar30->display_order_hint;
            uVar11 = pRVar30->pyramid_level;
          }
          *(uint *)(&local_a8.sum + uVar20) = uVar11;
        }
        uVar20 = uVar20 + 1;
        puVar22 = puVar22 + 8;
        lVar29 = lVar29 + -1;
      } while (uVar20 != 8);
    }
    uVar11 = (uint)(pAVar36->gf_group).arf_src_offset[bVar24] +
             (cpi->common).current_frame.frame_number;
    if ((pAVar36->gf_group).frame_parallel_level[bVar24] == 0) {
      if ((cpi->ext_flags).refresh_frame.update_pending == false) {
        av1_get_ref_frames((RefFrameMapPair *)&local_a8,uVar11,cpi,(uint)bVar24,1,
                           (cpi->common).remapped_ref_idx);
      }
      else if (((pAVar15->rtc_ref).set_ref_frame_config != 0) ||
              (iVar12 = use_rtc_reference_structure_one_layer(cpi), iVar12 != 0)) {
        lVar29 = 0;
        do {
          (cpi->common).remapped_ref_idx[lVar29] = (pAVar15->rtc_ref).ref_idx[lVar29];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 7);
      }
    }
    lVar29 = 0;
    bVar24 = 0;
    do {
      bVar1 = bVar24;
      if (((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar29] - 1U) < 8) &&
         (lVar34 = (long)(cpi->common).remapped_ref_idx
                         [(byte)"\x01\a\x05\x04\x06\x02\x03"[lVar29] - 1], lVar34 != -1)) {
        pRVar30 = (cpi->common).ref_frame_map[lVar34];
      }
      else {
        pRVar30 = (RefCntBuffer *)0x0;
      }
      pYVar23 = &pRVar30->buf;
      bVar38 = pRVar30 != (RefCntBuffer *)0x0;
      if (!bVar38) {
        pYVar23 = (YV12_BUFFER_CONFIG *)0x0;
      }
      local_68[lVar29] = (long)pYVar23;
      lVar29 = lVar29 + 1;
      bVar24 = bVar1 | bVar38;
    } while (lVar29 != 7);
    if ((!(bool)(bVar1 | bVar38)) && ((local_138.frame_type & 0xfd) == 1)) {
      return 1;
    }
    if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
       ((cpi->oxcf).mode == '\x01')) {
      bVar38 = (cpi->oxcf).gf_cfg.lag_in_frames == 0;
    }
    else {
      bVar38 = false;
    }
    local_138.ref_frame_flags = (cpi->ext_flags).ref_frame_flags;
    lVar29 = 1;
    do {
      uVar32 = (uint)lVar29;
      if (lVar29 == 3 && bVar38) {
        uVar32 = (cpi->sf).rt_sf.use_nonrd_altref_frame + 1;
      }
      if (0 < (int)uVar32) {
        uVar20 = 0;
        do {
          if ((local_68[lVar29] == local_68[uVar20]) &&
             (((uint)local_138.ref_frame_flags >>
               ((byte)("\x01\a\x05\x04\x06\x02\x03"[uVar20] - 1) & 0x1f) & 1) != 0)) {
            local_138.ref_frame_flags =
                 local_138.ref_frame_flags &
                 ~(1 << ((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar29] - 1) & 0x1f));
            break;
          }
          uVar20 = uVar20 + 1;
        } while (uVar32 != uVar20);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 != 7);
    pAVar15 = cpi->ppi;
    bVar24 = cpi->gf_frame_index;
    uVar20 = (ulong)bVar24;
    iVar12 = 7;
    if ((((pAVar15->gf_group).is_frame_non_ref[uVar20] == false) &&
        ((local_138._0_8_ & 0xfd00000000) != 0)) &&
       ((local_138.error_resilient_mode == 0 && ((cpi->ext_flags).use_primary_ref_none == false))))
    {
      if (cpi->use_ducky_encode == 0) {
        iVar12 = 0;
        if ((cpi->common).tiles.large_scale == 0) {
          if ((pAVar15->use_svc == 0) && ((pAVar15->rtc_ref).set_ref_frame_config == 0)) {
            uVar26 = (ulong)(uint)(pAVar15->gf_group).layer_depth[uVar20];
            lVar29 = 7;
            if (uVar26 < 8) {
              lVar29 = *(long *)(&DAT_00565df8 + uVar26 * 8);
            }
            iVar12 = 7;
            lVar34 = 0;
            do {
              if ((cpi->common).remapped_ref_idx[lVar34] == pAVar15->fb_of_context_type[lVar29]) {
                iVar12 = (int)lVar34;
              }
              lVar34 = lVar34 + 1;
            } while (lVar34 != 7);
          }
          else {
            iVar12 = av1_svc_primary_ref_frame(cpi);
            bVar24 = cpi->gf_frame_index;
            uVar20 = (ulong)bVar24;
          }
        }
      }
      else {
        lVar29 = 0;
        do {
          if ((cpi->common).remapped_ref_idx[lVar29] == (pAVar15->gf_group).primary_ref_idx[uVar20])
          {
            iVar12 = (int)lVar29;
            break;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 7);
      }
    }
    local_138.order_offset._0_1_ = (pAVar36->gf_group).arf_src_offset[uVar20];
    local_138.primary_ref_frame = iVar12;
    local_138.order_offset._1_3_ = 0;
    if (cpi->refresh_idx_available == false) {
      iVar12 = av1_get_refresh_frame_flags
                         (cpi,&local_138,FVar2,(uint)bVar24,uVar11,(RefFrameMapPair *)&local_a8);
    }
    else {
      iVar12 = 1 << ((byte)cpi->ref_refresh_index & 0x1f);
    }
    iVar13 = local_138.show_frame;
    iVar14 = 0;
    if ((pAVar36->gf_group).is_frame_non_ref[uVar20] == false) {
      iVar14 = iVar12;
    }
    local_138.refresh_frame_flags = iVar14;
    local_138.show_frame = iVar13;
    local_138.existing_fb_idx_to_show = 0xffffffff;
    if (local_138.show_existing_frame != 0) {
      lVar29 = 0;
      do {
        pRVar30 = (cpi->common).ref_frame_map[lVar29];
        if ((pRVar30 != (RefCntBuffer *)0x0) && (pRVar30->display_order_hint == uVar11)) {
          local_138.existing_fb_idx_to_show = (int)lVar29;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 8);
    }
  }
  uVar5 = *(undefined8 *)(cpi->common).remapped_ref_idx;
  uVar6 = *(undefined8 *)((cpi->common).remapped_ref_idx + 2);
  uVar7 = *(undefined8 *)((cpi->common).remapped_ref_idx + 4);
  uVar8 = *(undefined8 *)((cpi->common).remapped_ref_idx + 6);
  local_138.remapped_ref_idx[4] = (int)uVar7;
  local_138.remapped_ref_idx[5] = (int)((ulong)uVar7 >> 0x20);
  local_138.remapped_ref_idx[6] = (int)uVar8;
  local_138.remapped_ref_idx[7] = (int)((ulong)uVar8 >> 0x20);
  local_138.remapped_ref_idx[0] = (int)uVar5;
  local_138.remapped_ref_idx[1] = (int)((ulong)uVar5 >> 0x20);
  local_138.remapped_ref_idx[2] = (int)uVar6;
  local_138.remapped_ref_idx[3] = (int)((ulong)uVar6 >> 0x20);
  (cpi->td).mb.delta_qindex = 0;
  (cpi->td).mb.rdmult_delta_qindex = 0;
  if (local_138.show_existing_frame == 0) {
    (cpi->common).quant_params.using_qmatrix = (cpi->oxcf).q_cfg.using_qm;
  }
  aVar27 = (cpi->oxcf).pass;
  if (aVar27 == AOM_RC_FIRST_PASS) {
    pAVar36 = cpi->ppi;
LAB_003c038c:
    bVar24 = (pAVar36->gf_group).update_type[cpi->gf_frame_index];
    iVar12 = av1_gop_is_second_arf(&pAVar36->gf_group,(uint)cpi->gf_frame_index);
    iVar13 = av1_is_temporal_filter_on(&cpi->oxcf);
    bVar38 = true;
    if ((iVar13 != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) {
      bVar38 = cpi->compressor_stage == '\x01';
    }
    if ((((iVar12 == 0) && (bVar24 != 3)) && (bVar24 != 0)) || (bVar38)) {
LAB_003c047b:
      bVar38 = true;
      plVar16 = (lookahead_entry *)local_158.source;
    }
    else {
      if (local_138.frame_type == '\0') {
        if ((((cpi->oxcf).kf_cfg.enable_keyframe_filtering != 0) &&
            (local_138.show_existing_frame == 0)) &&
           (((cpi->oxcf).rc_cfg.best_allowed_q != 0 || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0))))
        {
          local_a8.sum = 0;
          av1_estimate_noise_level
                    (local_158.source,(double *)&local_a8,0,0,((cpi->common).seq_params)->bit_depth,
                     0x32);
          if (0.0 < (double)local_a8.sum) {
            av1_setup_past_independence(local_d8);
            goto LAB_003c04a7;
          }
        }
        goto LAB_003c047b;
      }
      if ((iVar12 == 0) || ((cpi->sf).hl_sf.second_alt_ref_filtering != 0)) {
LAB_003c04a7:
        plVar16 = (lookahead_entry *)local_158.source;
        iVar14 = 0;
        local_68[0]._0_4_ = 0;
        local_ac = 0;
        iVar13 = av1_rc_pick_q_and_bounds
                           (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                            (uint)cpi->gf_frame_index,&local_ac,(int *)local_68);
        (cpi->common).current_frame.frame_type = local_138.frame_type;
        if ((bVar24 == 3) || (bVar24 == 0)) {
          plVar18 = (lookahead_entry *)
                    av1_tf_info_get_filtered_buf
                              (&cpi->ppi->tf_info,(uint)cpi->gf_frame_index,&local_a8);
          if (plVar18 != (lookahead_entry *)0x0) {
            local_158.source = (YV12_BUFFER_CONFIG *)plVar18;
            iVar14 = av1_check_show_filtered_frame
                               ((YV12_BUFFER_CONFIG *)plVar18,&local_a8,iVar13,
                                ((cpi->common).seq_params)->bit_depth);
            if (iVar14 == 0) {
              uVar11 = 0;
            }
            else {
              uVar11 = (cpi->common).showable_frame | 1;
            }
            (cpi->common).showable_frame = uVar11;
          }
          if ((pAVar36->gf_group).frame_type[cpi->gf_frame_index] != '\0') {
            cpi->ppi->show_existing_alt_ref = iVar14;
          }
        }
        if (iVar12 != 0) {
          pSVar4 = (cpi->common).seq_params;
          iVar12 = aom_realloc_frame_buffer
                             (&(cpi->ppi->tf_info).tf_buf_second_arf,(cpi->oxcf).frm_dim_cfg.width,
                              (cpi->oxcf).frm_dim_cfg.height,pSVar4->subsampling_x,
                              pSVar4->subsampling_y,(uint)pSVar4->use_highbitdepth,
                              (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                              (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,
                              (void *)0x0,cpi->alloc_pyramid,0);
          if (iVar12 != 0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate tf_buf_second_arf");
          }
          pYVar23 = &(cpi->ppi->tf_info).tf_buf_second_arf;
          av1_temporal_filter(cpi,(uint)(pAVar36->gf_group).arf_src_offset[cpi->gf_frame_index],
                              (uint)cpi->gf_frame_index,&local_a8,pYVar23);
          iVar12 = av1_check_show_filtered_frame
                             (pYVar23,&local_a8,iVar13,((cpi->common).seq_params)->bit_depth);
          if (iVar12 != 0) {
            aom_extend_frame_borders_c
                      (pYVar23,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
            local_158.source = pYVar23;
          }
          piVar35 = &(cpi->common).showable_frame;
          *(byte *)piVar35 = (byte)*piVar35 | 1;
        }
        arr = ((YV12_BUFFER_CONFIG *)&(plVar16->img).field_0)->metadata;
        if ((arr != (aom_metadata_array_t *)0x0) &&
           (iVar12 = aom_copy_metadata_to_frame_buffer(local_158.source,arr), iVar12 != 0)) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to copy source metadata to the temporal filtered frame");
        }
        bVar38 = false;
      }
      else {
        bVar38 = true;
        plVar16 = (lookahead_entry *)local_158.source;
      }
    }
    FVar9 = local_138.frame_type;
    (cpi->common).show_frame = local_138.show_frame;
    (cpi->common).current_frame.frame_type = local_138.frame_type;
    av1_set_frame_size(cpi,(cpi->common).width,(cpi->common).height);
    if ((FVar9 == '\0') || ((bVar24 & 0xfe) == 2)) {
      av1_set_mv_search_params(cpi);
    }
    if (((cpi->gf_frame_index == '\0') && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) {
      cVar39 = '\0';
      if (1 < (cpi->oxcf).gf_cfg.lag_in_frames) {
        cVar39 = (cpi->oxcf).algo_cfg.enable_tpl_model;
      }
      if (0x69 < (pAVar36->gf_group).size) {
        cVar39 = '\0';
      }
      if (local_138.frame_type == '\0') {
LAB_003c075c:
        if (cVar39 != '\0') {
LAB_003c0760:
          if (*local_c8 == 0) {
            av1_tpl_preload_rc_estimate(cpi,&local_138);
            av1_tpl_setup_stats(cpi,0,&local_138);
          }
          goto LAB_003c0799;
        }
      }
      else if (cVar39 != '\0') {
        if ((bVar24 & 0xfe) == 2) goto LAB_003c0760;
        if (cpi->use_ducky_encode != 0) {
          cVar39 = (cpi->ducky_encode_info).frame_info.gop_mode == '\x01';
          goto LAB_003c075c;
        }
      }
      av1_init_tpl_stats(&cpi->ppi->tpl_data);
    }
LAB_003c0799:
    iVar12 = av1_encode(cpi,local_c0,local_b8,&local_158,&local_138,&local_d0);
    psVar37 = local_e0;
    if (bVar38 || iVar12 != 0) goto LAB_003c07cd;
    if (cpi->ppi->b_calculate_psnr == 0) goto LAB_003c0879;
    bVar38 = true;
    if ((cpi->oxcf).pass != AOM_RC_FIRST_PASS) {
      if (cpi->compressor_stage != '\x01') {
        if (((cpi->common).show_frame != 0) && (cpi->is_dropped_frame == false)) {
          pYVar23 = av1_realloc_and_scale_if_required
                              (local_d8,&plVar16->img,&cpi->scaled_source,
                               (cpi->common).features.interp_filter,0,false,true,
                               (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
          cpi->source = pYVar23;
          cpi->unscaled_source = &plVar16->img;
        }
        goto LAB_003c0879;
      }
      bVar38 = false;
    }
  }
  else {
    if ((cpi->compressor_stage != '\x01') && ((local_138._0_8_ & 0xfd00000000) == 0)) {
      av1_set_screen_content_options(cpi,&(cpi->common).features);
      aVar27 = (cpi->oxcf).pass;
    }
    pAVar36 = cpi->ppi;
    if ((((aVar27 != AOM_RC_ONE_PASS) || (pAVar36->lap_enabled != 0)) ||
        ((cpi->oxcf).mode != '\x01')) || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)) goto LAB_003c038c;
    iVar12 = av1_encode(cpi,local_c0,local_b8,&local_158,&local_138,&local_d0);
LAB_003c07cd:
    psVar37 = local_e0;
    if (iVar12 != 0) {
      return 1;
    }
LAB_003c0879:
    bVar38 = (cpi->oxcf).pass == AOM_RC_FIRST_PASS;
  }
  pAVar36 = cpi->ppi;
  if (pAVar36->b_calculate_psnr == 0) {
    if (bVar38) goto LAB_003c095f;
  }
  else {
    if ((bVar38) || (cpi->compressor_stage == '\x01')) goto LAB_003c095f;
    if (((cpi->common).show_frame != 0) &&
       ((cpi->is_dropped_frame == false && ((cpi->sf).rt_sf.use_rtc_tf != 0)))) {
      cpi->source = &cpi->orig_source;
    }
  }
  if (cpi->compressor_stage == '\x01') goto LAB_003c095f;
  bVar24 = (cpi->common).current_frame.frame_type;
  if (((cpi->common).show_existing_frame == 0) ||
     (((cpi->common).features.error_resilient_mode & bVar24 != 0) != 0)) {
    uVar11 = (*frame_flags & 0xfffffff1) + (uint)(cpi->refresh_frame).golden_frame * 2 +
             (uint)(cpi->refresh_frame).alt_ref_frame * 8 +
             (uint)(cpi->refresh_frame).bwd_ref_frame * 4;
    if (bVar24 != 0) {
      uVar11 = uVar11 & 0xfffffffe;
      goto LAB_003c0932;
    }
    uVar11 = uVar11 | 1;
LAB_003c0948:
    uVar32 = 0x10;
LAB_003c094d:
    uVar11 = uVar11 | uVar32;
    *frame_flags = uVar11;
  }
  else {
    uVar11 = *frame_flags & 0xfffffff0;
LAB_003c0932:
    *frame_flags = uVar11;
    if ((bVar24 & 0xfd) == 0) goto LAB_003c0948;
    uVar32 = 0x20;
    if (bVar24 == 3) goto LAB_003c094d;
  }
  if ((cpi->common).features.error_resilient_mode == true) {
    *frame_flags = uVar11 | 0x40;
  }
LAB_003c095f:
  *psVar37 = local_d0;
  if (local_d0 != 0) {
    if ((pAVar36->rtc_ref).set_ref_frame_config == 0) {
      uVar11 = 0;
      if (((((cpi->ext_flags).refresh_frame.update_pending == true) &&
           ((cpi->ext_flags).refresh_frame.alt_ref_frame == false)) &&
          ((cpi->ext_flags).refresh_frame.alt2_ref_frame == false)) &&
         (((cpi->ext_flags).refresh_frame.bwd_ref_frame == false &&
          ((cpi->ext_flags).refresh_frame.golden_frame == false)))) {
        uVar11 = (cpi->ext_flags).refresh_frame.last_frame ^ 1;
      }
    }
    else {
      uVar11 = (pAVar36->rtc_ref).non_reference_frame;
    }
    cpi->droppable = uVar11;
    if (((pAVar36->use_svc != 0) || (0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
       (((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1 &&
        ((((cpi->svc).temporal_layer_id == 0 &&
          (pYVar23 = cpi->unscaled_source,
          (pYVar23->field_0).field_0.y_width == (cpi->svc).source_last_TL0.field_0.field_0.y_width))
         && ((pYVar23->field_1).field_0.y_height ==
             (cpi->svc).source_last_TL0.field_1.field_0.y_height)))))) {
      dst_ybc = &(cpi->svc).source_last_TL0;
      aom_yv12_copy_y_c(pYVar23,dst_ybc,1);
      aom_yv12_copy_u_c(cpi->unscaled_source,dst_ybc,1);
      aom_yv12_copy_v_c(cpi->unscaled_source,dst_ybc,1);
    }
  }
  return 0;
}

Assistant:

int av1_encode_strategy(AV1_COMP *const cpi, size_t *const size,
                        uint8_t *const dest, size_t dest_size,
                        unsigned int *frame_flags, int64_t *const time_stamp,
                        int64_t *const time_end,
                        const aom_rational64_t *const timestamp_ratio,
                        int *const pop_lookahead, int flush) {
  AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  ExternalFlags *const ext_flags = &cpi->ext_flags;
  GFConfig *const gf_cfg = &oxcf->gf_cfg;

  EncodeFrameInput frame_input;
  EncodeFrameParams frame_params;
  size_t frame_size;
  memset(&frame_input, 0, sizeof(frame_input));
  memset(&frame_params, 0, sizeof(frame_params));
  frame_size = 0;

#if CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
  VBR_RATECTRL_INFO *vbr_rc_info = &cpi->vbr_rc_info;
  if (oxcf->pass == AOM_RC_THIRD_PASS && vbr_rc_info->ready == 0) {
    THIRD_PASS_FRAME_INFO frame_info[MAX_THIRD_PASS_BUF];
    av1_open_second_pass_log(cpi, 1);
    FILE *second_pass_log_stream = cpi->second_pass_log_stream;
    fseek(second_pass_log_stream, 0, SEEK_END);
    size_t file_size = ftell(second_pass_log_stream);
    rewind(second_pass_log_stream);
    size_t read_size = 0;
    while (read_size < file_size) {
      THIRD_PASS_GOP_INFO gop_info;
      struct aom_internal_error_info *error = cpi->common.error;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(second_pass_log_stream, &gop_info, error);
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cm->error, tpl_info, aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, second_pass_log_stream, error);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(second_pass_log_stream, frame_info,
                                          gop_info.num_frames, error);
      av1_vbr_rc_append_tpl_info(vbr_rc_info, tpl_info);
      read_size = ftell(second_pass_log_stream);
      aom_free(tpl_info);
    }
    av1_close_second_pass_log(cpi);
    if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
      vbr_rc_info->base_q_index = cpi->oxcf.rc_cfg.cq_level;
      av1_vbr_rc_compute_q_indices(
          vbr_rc_info->base_q_index, vbr_rc_info->total_frame_count,
          vbr_rc_info->qstep_ratio_list, cm->seq_params->bit_depth,
          vbr_rc_info->q_index_list);
    } else {
      vbr_rc_info->base_q_index = av1_vbr_rc_info_estimate_base_q(
          vbr_rc_info->total_bit_budget, cm->seq_params->bit_depth,
          vbr_rc_info->scale_factors, vbr_rc_info->total_frame_count,
          vbr_rc_info->update_type_list, vbr_rc_info->qstep_ratio_list,
          vbr_rc_info->txfm_stats_list, vbr_rc_info->q_index_list, NULL);
    }
    vbr_rc_info->ready = 1;
#if CONFIG_RATECTRL_LOG
    rc_log_record_chunk_info(&cpi->rc_log, vbr_rc_info->base_q_index,
                             vbr_rc_info->total_frame_count);
#endif  // CONFIG_RATECTRL_LOG
  }
#endif  // CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS

  // Check if we need to stuff more src frames
  if (flush == 0) {
    int srcbuf_size =
        av1_lookahead_depth(cpi->ppi->lookahead, cpi->compressor_stage);
    int pop_size =
        av1_lookahead_pop_sz(cpi->ppi->lookahead, cpi->compressor_stage);

    // Continue buffering look ahead buffer.
    if (srcbuf_size < pop_size) return -1;
  }

  if (!av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage)) {
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // TODO(sarahparker) finish bit allocation for one pass pyramid
  if (has_no_stats_stage(cpi)) {
    gf_cfg->gf_max_pyr_height =
        AOMMIN(gf_cfg->gf_max_pyr_height, USE_ALTREF_FOR_ONE_PASS);
    gf_cfg->gf_min_pyr_height =
        AOMMIN(gf_cfg->gf_min_pyr_height, gf_cfg->gf_max_pyr_height);
  }

  // Allocation of mi buffers.
  alloc_mb_mode_info_buffers(cpi);

  cpi->skip_tpl_setup_stats = 0;
#if !CONFIG_REALTIME_ONLY
  if (oxcf->pass != AOM_RC_FIRST_PASS) {
    TplParams *const tpl_data = &cpi->ppi->tpl_data;
    if (tpl_data->tpl_stats_pool[0] == NULL) {
      av1_setup_tpl_buffers(cpi->ppi, &cm->mi_params, oxcf->frm_dim_cfg.width,
                            oxcf->frm_dim_cfg.height, 0,
                            oxcf->gf_cfg.lag_in_frames);
    }
  }
  cpi->twopass_frame.this_frame = NULL;
  const int use_one_pass_rt_params = is_one_pass_rt_params(cpi);
  if (!use_one_pass_rt_params && !is_stat_generation_stage(cpi)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_get_second_pass_params_time);
#endif

    // Initialise frame_level_rate_correction_factors with value previous
    // to the parallel frames.
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      for (int i = 0; i < RATE_FACTOR_LEVELS; i++) {
        cpi->rc.frame_level_rate_correction_factors[i] =
#if CONFIG_FPMT_TEST
            (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
                ? cpi->ppi->p_rc.temp_rate_correction_factors[i]
                :
#endif  // CONFIG_FPMT_TEST
                cpi->ppi->p_rc.rate_correction_factors[i];
      }
    }

    // copy mv_stats from ppi to frame_level cpi.
    cpi->mv_stats = cpi->ppi->mv_stats;
    av1_get_second_pass_params(cpi, &frame_params, *frame_flags);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_get_second_pass_params_time);
#endif
  }
#endif

  if (!is_stat_generation_stage(cpi)) {
    // TODO(jingning): fwd key frame always uses show existing frame?
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE &&
        gf_group->refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      frame_params.show_existing_frame = 1;
    } else {
      frame_params.show_existing_frame =
          (cpi->ppi->show_existing_alt_ref &&
           gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE;
    }
    frame_params.show_existing_frame &= allow_show_existing(cpi, *frame_flags);

    // Special handling to reset 'show_existing_frame' in case of dropped
    // frames.
    if (oxcf->rc_cfg.drop_frames_water_mark &&
        (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE ||
         gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE)) {
      // During the encode of an OVERLAY_UPDATE/INTNL_OVERLAY_UPDATE frame, loop
      // over the gf group to check if the corresponding
      // ARF_UPDATE/INTNL_ARF_UPDATE frame was dropped.
      int cur_disp_idx = gf_group->display_idx[cpi->gf_frame_index];
      for (int idx = 0; idx < cpi->gf_frame_index; idx++) {
        if (cur_disp_idx == gf_group->display_idx[idx]) {
          assert(IMPLIES(
              gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE,
              gf_group->update_type[idx] == ARF_UPDATE));
          assert(IMPLIES(gf_group->update_type[cpi->gf_frame_index] ==
                             INTNL_OVERLAY_UPDATE,
                         gf_group->update_type[idx] == INTNL_ARF_UPDATE));
          // Reset show_existing_frame and set cpi->is_dropped_frame to true if
          // the frame was dropped during its first encode.
          if (gf_group->is_frame_dropped[idx]) {
            frame_params.show_existing_frame = 0;
            assert(!cpi->is_dropped_frame);
            cpi->is_dropped_frame = true;
          }
          break;
        }
      }
    }

    // Reset show_existing_alt_ref decision to 0 after it is used.
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) {
      cpi->ppi->show_existing_alt_ref = 0;
    }
  } else {
    frame_params.show_existing_frame = 0;
  }

  struct lookahead_entry *source = NULL;
  struct lookahead_entry *last_source = NULL;
  if (frame_params.show_existing_frame) {
    source = av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage);
    *pop_lookahead = 1;
    frame_params.show_frame = 1;
  } else {
    source = choose_frame_source(cpi, &flush, pop_lookahead, &last_source,
                                 &frame_params.show_frame);
  }

  if (source == NULL) {  // If no source was found, we can't encode a frame.
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // reset src_offset to allow actual encode call for this frame to get its
  // source.
  gf_group->src_offset[cpi->gf_frame_index] = 0;

  // Source may be changed if temporal filtered later.
  frame_input.source = &source->img;
  if ((cpi->ppi->use_svc || cpi->rc.prev_frame_is_dropped) &&
      last_source != NULL)
    av1_svc_set_last_source(cpi, &frame_input, &last_source->img);
  else
    frame_input.last_source = last_source != NULL ? &last_source->img : NULL;
  frame_input.ts_duration = source->ts_end - source->ts_start;
  // Save unfiltered source. It is used in av1_get_second_pass_params().
  cpi->unfiltered_source = frame_input.source;

  *time_stamp = source->ts_start;
  *time_end = source->ts_end;
  if (source->ts_start < cpi->time_stamps.first_ts_start) {
    cpi->time_stamps.first_ts_start = source->ts_start;
    cpi->time_stamps.prev_ts_end = source->ts_start;
  }

  av1_apply_encoding_flags(cpi, source->flags);
  *frame_flags = (source->flags & AOM_EFLAG_FORCE_KF) ? FRAMEFLAGS_KEY : 0;

#if CONFIG_FPMT_TEST
  if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      cpi->framerate = cpi->temp_framerate;
    }
  }
#endif  // CONFIG_FPMT_TEST

  // Shown frames and arf-overlay frames need frame-rate considering
  if (frame_params.show_frame)
    adjust_frame_rate(cpi, source->ts_start, source->ts_end);

  if (!frame_params.show_existing_frame) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->film_grain_table) {
      cm->cur_frame->film_grain_params_present = aom_film_grain_table_lookup(
          cpi->film_grain_table, *time_stamp, *time_end, 0 /* =erase */,
          &cm->film_grain_params);
    } else {
      cm->cur_frame->film_grain_params_present =
          cm->seq_params->film_grain_params_present;
    }
#endif
    // only one operating point supported now
    const int64_t pts64 = ticks_to_timebase_units(timestamp_ratio, *time_stamp);
    if (pts64 < 0 || pts64 > UINT32_MAX) return AOM_CODEC_ERROR;

    cm->frame_presentation_time = (uint32_t)pts64;
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_get_one_pass_rt_params_time);
#endif
#if CONFIG_REALTIME_ONLY
  av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                             *frame_flags);
  if (use_rtc_reference_structure_one_layer(cpi))
    av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
#else
  if (use_one_pass_rt_params) {
    av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                               *frame_flags);
    if (use_rtc_reference_structure_one_layer(cpi))
      av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
  }
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_get_one_pass_rt_params_time);
#endif

  FRAME_UPDATE_TYPE frame_update_type =
      get_frame_update_type(gf_group, cpi->gf_frame_index);

  if (frame_params.show_existing_frame &&
      frame_params.frame_type != KEY_FRAME) {
    // Force show-existing frames to be INTER, except forward keyframes
    frame_params.frame_type = INTER_FRAME;
  }

  // Per-frame encode speed.  In theory this can vary, but things may have
  // been written assuming speed-level will not change within a sequence, so
  // this parameter should be used with caution.
  frame_params.speed = oxcf->speed;

#if !CONFIG_REALTIME_ONLY
  // Set forced key frames when necessary. For two-pass encoding / lap mode,
  // this is already handled by av1_get_second_pass_params. However when no
  // stats are available, we still need to check if the new frame is a keyframe.
  // For one pass rt, this is already checked in av1_get_one_pass_rt_params.
  if (!use_one_pass_rt_params &&
      (is_stat_generation_stage(cpi) || has_no_stats_stage(cpi))) {
    // Current frame is coded as a key-frame for any of the following cases:
    // 1) First frame of a video
    // 2) For all-intra frame encoding
    // 3) When a key-frame is forced
    const int kf_requested =
        (cm->current_frame.frame_number == 0 ||
         oxcf->kf_cfg.key_freq_max == 0 || (*frame_flags & FRAMEFLAGS_KEY));
    if (kf_requested && frame_update_type != OVERLAY_UPDATE &&
        frame_update_type != INTNL_OVERLAY_UPDATE) {
      frame_params.frame_type = KEY_FRAME;
    } else if (is_stat_generation_stage(cpi)) {
      // For stats generation, set the frame type to inter here.
      frame_params.frame_type = INTER_FRAME;
    }
  }
#endif

  // Work out some encoding parameters specific to the pass:
  if (has_no_stats_stage(cpi) && oxcf->q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
    av1_cyclic_refresh_update_parameters(cpi);
  } else if (is_stat_generation_stage(cpi)) {
    cpi->td.mb.e_mbd.lossless[0] = is_lossless_requested(&oxcf->rc_cfg);
  } else if (is_stat_consumption_stage(cpi)) {
#if CONFIG_MISMATCH_DEBUG
    mismatch_move_frame_idx_w();
#endif
#if TXCOEFF_COST_TIMER
    cm->txcoeff_cost_timer = 0;
    cm->txcoeff_cost_count = 0;
#endif
  }

  if (!is_stat_generation_stage(cpi))
    set_ext_overrides(cm, &frame_params, ext_flags);

  // Shown keyframes and S frames refresh all reference buffers
  const int force_refresh_all =
      ((frame_params.frame_type == KEY_FRAME && frame_params.show_frame) ||
       frame_params.frame_type == S_FRAME) &&
      !frame_params.show_existing_frame;

  av1_configure_buffer_updates(
      cpi, &frame_params.refresh_frame, frame_update_type,
      gf_group->refbuf_state[cpi->gf_frame_index], force_refresh_all);

  if (!is_stat_generation_stage(cpi)) {
    const YV12_BUFFER_CONFIG *ref_frame_buf[INTER_REFS_PER_FRAME];

    RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
    init_ref_map_pair(cpi, ref_frame_map_pairs);
    const int order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];
    const int cur_frame_disp =
        cpi->common.current_frame.frame_number + order_offset;

    int get_ref_frames = 0;
#if CONFIG_FPMT_TEST
    get_ref_frames =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
    if (get_ref_frames ||
        gf_group->frame_parallel_level[cpi->gf_frame_index] == 0) {
      if (!ext_flags->refresh_frame.update_pending) {
        av1_get_ref_frames(ref_frame_map_pairs, cur_frame_disp, cpi,
                           cpi->gf_frame_index, 1, cm->remapped_ref_idx);
      } else if (cpi->ppi->rtc_ref.set_ref_frame_config ||
                 use_rtc_reference_structure_one_layer(cpi)) {
        for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++)
          cm->remapped_ref_idx[i] = cpi->ppi->rtc_ref.ref_idx[i];
      }
    }

    // Get the reference frames
    bool has_ref_frames = false;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      const RefCntBuffer *ref_frame =
          get_ref_frame_buf(cm, ref_frame_priority_order[i]);
      ref_frame_buf[i] = ref_frame != NULL ? &ref_frame->buf : NULL;
      if (ref_frame != NULL) has_ref_frames = true;
    }
    if (!has_ref_frames && (frame_params.frame_type == INTER_FRAME ||
                            frame_params.frame_type == S_FRAME)) {
      return AOM_CODEC_ERROR;
    }

    // Work out which reference frame slots may be used.
    frame_params.ref_frame_flags =
        get_ref_frame_flags(&cpi->sf, is_one_pass_rt_params(cpi), ref_frame_buf,
                            ext_flags->ref_frame_flags);

    // Set primary_ref_frame of non-reference frames as PRIMARY_REF_NONE.
    if (cpi->ppi->gf_group.is_frame_non_ref[cpi->gf_frame_index]) {
      frame_params.primary_ref_frame = PRIMARY_REF_NONE;
    } else {
      frame_params.primary_ref_frame =
          choose_primary_ref_frame(cpi, &frame_params);
    }

    frame_params.order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];

    // Call av1_get_refresh_frame_flags() if refresh index not available.
    if (!cpi->refresh_idx_available) {
      frame_params.refresh_frame_flags = av1_get_refresh_frame_flags(
          cpi, &frame_params, frame_update_type, cpi->gf_frame_index,
          cur_frame_disp, ref_frame_map_pairs);
    } else {
      assert(cpi->ref_refresh_index != INVALID_IDX);
      frame_params.refresh_frame_flags = (1 << cpi->ref_refresh_index);
    }

    // Make the frames marked as is_frame_non_ref to non-reference frames.
    if (gf_group->is_frame_non_ref[cpi->gf_frame_index])
      frame_params.refresh_frame_flags = 0;

    frame_params.existing_fb_idx_to_show = INVALID_IDX;
    // Find the frame buffer to show based on display order.
    if (frame_params.show_existing_frame) {
      for (int frame = 0; frame < REF_FRAMES; frame++) {
        const RefCntBuffer *const buf = cm->ref_frame_map[frame];
        if (buf == NULL) continue;
        const int frame_order = (int)buf->display_order_hint;
        if (frame_order == cur_frame_disp)
          frame_params.existing_fb_idx_to_show = frame;
      }
    }
  }

  // The way frame_params->remapped_ref_idx is setup is a placeholder.
  // Currently, reference buffer assignment is done by update_ref_frame_map()
  // which is called by high-level strategy AFTER encoding a frame.  It
  // modifies cm->remapped_ref_idx.  If you want to use an alternative method
  // to determine reference buffer assignment, just put your assignments into
  // frame_params->remapped_ref_idx here and they will be used when encoding
  // this frame.  If frame_params->remapped_ref_idx is setup independently of
  // cm->remapped_ref_idx then update_ref_frame_map() will have no effect.
  memcpy(frame_params.remapped_ref_idx, cm->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  cpi->td.mb.rdmult_delta_qindex = cpi->td.mb.delta_qindex = 0;

  if (!frame_params.show_existing_frame) {
    cm->quant_params.using_qmatrix = oxcf->q_cfg.using_qm;
  }

  const int is_intra_frame = frame_params.frame_type == KEY_FRAME ||
                             frame_params.frame_type == INTRA_ONLY_FRAME;
  FeatureFlags *const features = &cm->features;
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->pass == AOM_RC_ONE_PASS || oxcf->pass >= AOM_RC_SECOND_PASS) &&
      is_intra_frame) {
    av1_set_screen_content_options(cpi, features);
  }

#if CONFIG_REALTIME_ONLY
  if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                 &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#else
  if (has_no_stats_stage(cpi) && oxcf->mode == REALTIME &&
      gf_cfg->lag_in_frames == 0) {
    if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                   &frame_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else if (denoise_and_encode(cpi, dest, dest_size, &frame_input,
                                &frame_params, &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#endif  // CONFIG_REALTIME_ONLY

  // This is used in rtc temporal filter case. Use true source in the PSNR
  // calculation.
  if (is_psnr_calc_enabled(cpi) && cpi->sf.rt_sf.use_rtc_tf) {
    assert(cpi->orig_source.buffer_alloc_sz > 0);
    cpi->source = &cpi->orig_source;
  }

  if (!is_stat_generation_stage(cpi)) {
    // First pass doesn't modify reference buffer assignment or produce frame
    // flags
    update_frame_flags(&cpi->common, &cpi->refresh_frame, frame_flags);
    set_additional_frame_flags(cm, frame_flags);
  }

#if !CONFIG_REALTIME_ONLY
#if TXCOEFF_COST_TIMER
  if (!is_stat_generation_stage(cpi)) {
    cm->cum_txcoeff_cost_timer += cm->txcoeff_cost_timer;
    fprintf(stderr,
            "\ntxb coeff cost block number: %ld, frame time: %ld, cum time %ld "
            "in us\n",
            cm->txcoeff_cost_count, cm->txcoeff_cost_timer,
            cm->cum_txcoeff_cost_timer);
  }
#endif
#endif  // !CONFIG_REALTIME_ONLY

#if CONFIG_TUNE_VMAF
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
       oxcf->tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN)) {
    av1_update_vmaf_curve(cpi);
  }
#endif

  *size = frame_size;

  // Leave a signal for a higher level caller about if this frame is droppable
  if (*size > 0) {
    cpi->droppable =
        is_frame_droppable(&cpi->ppi->rtc_ref, &ext_flags->refresh_frame);
  }

  // For SVC, or when frame-dropper is enabled:
  // keep track of the (unscaled) source corresponding to the refresh of LAST
  // reference (base temporal layer - TL0). Copy only for the
  // top spatial enhancement layer so all spatial layers of the next
  // superframe have last_source to be aligned with previous TL0 superframe.
  // Avoid cases where resolution changes for unscaled source (top spatial
  // layer). Only needs to be done for frame that are encoded (size > 0).
  if (*size > 0 &&
      (cpi->ppi->use_svc || cpi->oxcf.rc_cfg.drop_frames_water_mark > 0) &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
      cpi->svc.temporal_layer_id == 0 &&
      cpi->unscaled_source->y_width == cpi->svc.source_last_TL0.y_width &&
      cpi->unscaled_source->y_height == cpi->svc.source_last_TL0.y_height) {
    aom_yv12_copy_y(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_u(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_v(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
  }

  return AOM_CODEC_OK;
}